

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

bool Diligent::IsSRGBFormat(TEXTURE_FORMAT Fmt)

{
  undefined1 local_b;
  TEXTURE_FORMAT Fmt_local;
  
  local_b = true;
  if ((((((Fmt != TEX_FORMAT_RGBA8_UNORM_SRGB) && (local_b = true, Fmt != TEX_FORMAT_BC1_UNORM_SRGB)
         ) && (local_b = true, Fmt != TEX_FORMAT_BC2_UNORM_SRGB)) &&
       ((local_b = true, Fmt != TEX_FORMAT_BC3_UNORM_SRGB &&
        (local_b = true, Fmt != TEX_FORMAT_BGRA8_UNORM_SRGB)))) &&
      ((local_b = true, Fmt != TEX_FORMAT_BGRX8_UNORM_SRGB &&
       ((local_b = true, Fmt != TEX_FORMAT_BC7_UNORM_SRGB &&
        (local_b = true, Fmt != TEX_FORMAT_ETC2_RGB8_UNORM_SRGB)))))) &&
     (local_b = true, Fmt != TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB)) {
    local_b = Fmt == TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  }
  return local_b;
}

Assistant:

bool IsSRGBFormat(TEXTURE_FORMAT Fmt)
{
    return (Fmt == TEX_FORMAT_RGBA8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC1_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC2_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC3_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BGRA8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BGRX8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_BC7_UNORM_SRGB ||
            Fmt == TEX_FORMAT_ETC2_RGB8_UNORM_SRGB ||
            Fmt == TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB ||
            Fmt == TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB);
}